

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.h
# Opt level: O3

void __thiscall gui::Callback<gui::Widget_*>::~Callback(Callback<gui::Widget_*> *this)

{
  code *pcVar1;
  
  pcVar1 = *(code **)((long)&this->field_0 + 0x10);
  if (this->tag_ == withArgs) {
    if (pcVar1 != (code *)0x0) {
      (*pcVar1)(this,this,3);
    }
  }
  else if (pcVar1 != (code *)0x0) {
    (*pcVar1)(this,this,3);
  }
  return;
}

Assistant:

~Callback() {
        if (tag_ == Tag::withArgs) {
            withArgs_.~function();
        } else {
            noArgs_.~function();
        }
    }